

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O0

char * parse_tag(Btor2Parser *bfr)

{
  int32_t ch_00;
  Btor2Parser *in_RDI;
  int32_t ch;
  char *local_8;
  
  in_RDI->nbuf = 0;
  while (ch_00 = getc_bfr(in_RDI), 0x60 < ch_00 && ch_00 < 0x7b) {
    pushc_bfr(in_RDI,ch_00);
  }
  if (in_RDI->nbuf == 0) {
    perr_bfr(in_RDI,"expected tag");
    local_8 = (char *)0x0;
  }
  else if (ch_00 == 0x20) {
    pushc_bfr(in_RDI,0x20);
    local_8 = in_RDI->buf;
  }
  else {
    perr_bfr(in_RDI,"expected space after tag");
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static const char *
parse_tag (Btor2Parser *bfr)
{
  int32_t ch;
  bfr->nbuf = 0;
  while ('a' <= (ch = getc_bfr (bfr)) && ch <= 'z') pushc_bfr (bfr, ch);
  if (!bfr->nbuf)
  {
    perr_bfr (bfr, "expected tag");
    return 0;
  }
  if (ch != ' ')
  {
    perr_bfr (bfr, "expected space after tag");
    return 0;
  }
  pushc_bfr (bfr, 0);
  return bfr->buf;
}